

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerResults.cpp
# Opt level: O3

void __thiscall HdmiCecAnalyzerResults::GenOpCodeBubble(HdmiCecAnalyzerResults *this,Frame *frame)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  U64 number;
  char *pcVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  string opCodeStr;
  string opCodeText;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  string local_80;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  number = *(U64 *)(frame + 0x10);
  GetNumberString_abi_cxx11_(&local_80,this,number,8);
  pcVar2 = HdmiCec::GetOpCodeString((OpCode)number);
  std::__cxx11::string::string((string *)local_60,pcVar2,(allocator *)&local_e0);
  if (this->mTabular == false) {
    paVar1 = &local_e0.field_2;
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"O","");
    AnalyzerResults::AddResultString
              ((char *)this,local_e0._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    std::operator+(&local_e0,"Op. ",&local_80);
    AnalyzerResults::AddResultString
              ((char *)this,local_e0._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    std::operator+(&local_e0,"Opcode ",&local_80);
    AnalyzerResults::AddResultString
              ((char *)this,local_e0._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
  }
  std::operator+(&local_40,"Opcode ",&local_80);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_b0 = *plVar4;
    lStack_a8 = plVar3[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar4;
    local_c0 = (long *)*plVar3;
  }
  local_b8 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_60[0]);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_90 = *plVar4;
    lStack_88 = plVar3[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar4;
    local_a0 = (long *)*plVar3;
  }
  local_98 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_a0);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_e0.field_2._M_allocated_capacity = *psVar5;
    local_e0.field_2._8_8_ = plVar3[3];
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar5;
    local_e0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_e0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  AnalyzerResults::AddResultString
            ((char *)this,local_e0._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return;
}

Assistant:

void HdmiCecAnalyzerResults::GenOpCodeBubble( const Frame& frame )
{
    HdmiCec::OpCode opCode = static_cast<HdmiCec::OpCode>( frame.mData1 );
    std::string opCodeStr = GetNumberString( frame.mData1, 8 );
    std::string opCodeText = HdmiCec::GetOpCodeString( opCode );

    if( !mTabular )
    {
        AddResult( "O" );
        AddResult( "Op. " + opCodeStr );
        AddResult( "Opcode " + opCodeStr );
    }
    AddResult( "Opcode " + opCodeStr + " (" + opCodeText + ")" );
}